

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::IsGroupOf_PDU::Decode(IsGroupOf_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  GED_BasicRotorWingAircraft *pGVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  GEDList *this_01;
  byte bVar6;
  pointer pKVar7;
  KString local_60;
  KUINT8 *local_40;
  KUINT8 *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar3 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Decode","");
    KException::KException(this_00,&local_60,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vpGED).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vpGED).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar7 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar7->_vptr_KRef_Ptr)(pKVar7);
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar2);
    (this->m_vpGED).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_GroupedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_GroupedEntityID,stream);
  local_38 = &this->m_ui8GrpdEntCat;
  KDataStream::Read(stream,local_38);
  local_40 = &this->m_ui8NumOfGroupedEnts;
  KDataStream::Read(stream,local_40);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding1);
  KDataStream::Read<double>(stream,(double *)&this->m_f64GrpLat);
  KDataStream::Read<double>(stream,(double *)&this->m_f64GrpLon);
  if (this->m_ui8NumOfGroupedEnts != '\0') {
    this_01 = &this->m_vpGED;
    bVar6 = 0;
    do {
      switch(*local_38) {
      case '\x01':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
        DATA_TYPE::GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle
                  ((GED_BasicGroundCombatVehicle *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\x02':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedGroundCombatVehicle::GED_EnhancedGroundCombatVehicle
                  ((GED_EnhancedGroundCombatVehicle *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\x03':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
        DATA_TYPE::GED_BasicGroundCombatSoldier::GED_BasicGroundCombatSoldier
                  ((GED_BasicGroundCombatSoldier *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\x04':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedGroundCombatSoldier::GED_EnhancedGroundCombatSoldier
                  ((GED_EnhancedGroundCombatSoldier *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\x05':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_BasicRotorWingAircraft::GED_BasicRotorWingAircraft(pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\x06':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedRotaryWingAircraft::GED_EnhancedRotaryWingAircraft
                  ((GED_EnhancedRotaryWingAircraft *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\a':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
        DATA_TYPE::GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft
                  ((GED_BasicFixedWingAircraft *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\b':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedFixedWingAircraft::GED_EnhancedFixedWingAircraft
                  ((GED_EnhancedFixedWingAircraft *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      case '\t':
        pGVar4 = (GED_BasicRotorWingAircraft *)operator_new(0x28);
        DATA_TYPE::GED_GroundLogisticsVehicle::GED_GroundLogisticsVehicle
                  ((GED_GroundLogisticsVehicle *)pGVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
        local_60._M_string_length = (size_type)pGVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
        break;
      default:
        goto switchD_00268a59_default;
      }
      local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00320780;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::unRef((KRef_Ptr<KDIS::DATA_TYPE::GED> *)&local_60);
switchD_00268a59_default:
      bVar6 = bVar6 + 1;
    } while (bVar6 < *local_40);
  }
  return;
}

Assistant:

void IsGroupOf_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IS_GROUP_OF_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vpGED.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_GroupedEntityID
           >> m_ui8GrpdEntCat
           >> m_ui8NumOfGroupedEnts
           >> m_ui32Padding1
           >> m_f64GrpLat
           >> m_f64GrpLon;

    KUINT8 i = 0;

    while( i < m_ui8NumOfGroupedEnts )
    {
        switch( m_ui8GrpdEntCat )
        {
        case BasicGroundCombatVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicGroundCombatVehicle( stream ) ) );
            break;
        case EnhancedGroundCombatVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedGroundCombatVehicle( stream ) ) );
            break;
        case BasicGroundCombatSoldierGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicGroundCombatSoldier( stream ) ) );
            break;
        case EnhancedGroundCombatSoldierGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedGroundCombatSoldier( stream ) ) );
            break;
        case BasicRotorWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicRotorWingAircraft( stream ) ) );
            break;
        case EnhancedRotorWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedRotaryWingAircraft( stream ) ) );
            break;
        case BasicFixedWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicFixedWingAircraft( stream ) ) );
            break;
        case EnhancedFixedWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedFixedWingAircraft( stream ) ) );
            break;
        case GroundLogisticsVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_GroundLogisticsVehicle( stream ) ) );
            break;
        }
        ++i;
    }
}